

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::SetPlaneMapping
          (ON_TextureMapping *this,ON_Plane *plane,ON_Interval *dx,ON_Interval *dy,ON_Interval *dz)

{
  bool bVar1;
  double s;
  double t;
  double c;
  double local_178;
  double local_170;
  double local_168;
  ON_3dVector local_140;
  ON_3dVector local_128;
  ON_3dVector local_110;
  undefined1 local_f8 [8];
  ON_3dVector Z;
  ON_3dVector Y;
  ON_3dVector X;
  double sz;
  double sy;
  double sx;
  ON_3dVector zaxis;
  ON_3dVector yaxis;
  ON_3dVector xaxis;
  ON_3dPoint C;
  ON_Interval *dz_local;
  ON_Interval *dy_local;
  ON_Interval *dx_local;
  ON_Plane *plane_local;
  ON_TextureMapping *this_local;
  
  operator=(this,&Unset);
  bVar1 = ON_3dPoint::IsValid(&plane->origin);
  if (bVar1) {
    bVar1 = ON_IsRightHandFrame(&plane->xaxis,&plane->yaxis,&plane->zaxis);
    if (bVar1) {
      bVar1 = ON_Interval::IsValid(dx);
      if (((bVar1) && (bVar1 = ON_Interval::IsValid(dy), bVar1)) &&
         (bVar1 = ON_Interval::IsValid(dz), bVar1)) {
        s = ON_Interval::Mid(dx);
        t = ON_Interval::Mid(dy);
        c = ON_Interval::Mid(dz);
        ON_Plane::PointAt((ON_3dPoint *)&xaxis.z,plane,s,t,c);
        if ((xaxis.z != 0.0) || (NAN(xaxis.z))) {
          local_168 = -xaxis.z;
        }
        else {
          local_168 = 0.0;
        }
        xaxis.z = local_168;
        if ((C.x != 0.0) || (NAN(C.x))) {
          local_170 = -C.x;
        }
        else {
          local_170 = 0.0;
        }
        if ((C.y != 0.0) || (NAN(C.y))) {
          local_178 = -C.y;
        }
        else {
          local_178 = 0.0;
        }
        yaxis.z = (plane->xaxis).x;
        xaxis.x = (plane->xaxis).y;
        xaxis.y = (plane->xaxis).z;
        zaxis.z = (plane->yaxis).x;
        yaxis.x = (plane->yaxis).y;
        yaxis.y = (plane->yaxis).z;
        sx = (plane->zaxis).x;
        zaxis.x = (plane->zaxis).y;
        zaxis.y = (plane->zaxis).z;
        sy = ON_Interval::Length(dx);
        if ((sy == 0.0) && (!NAN(sy))) {
          sy = 2.0;
        }
        sz = ON_Interval::Length(dy);
        if ((sz == 0.0) && (!NAN(sz))) {
          sz = 2.0;
        }
        X.z = ON_Interval::Length(dz);
        if ((X.z == 0.0) && (!NAN(X.z))) {
          X.z = 2.0;
        }
        ::operator*((ON_3dVector *)&Y.z,2.0 / sy,(ON_3dVector *)&yaxis.z);
        ::operator*((ON_3dVector *)&Z.z,2.0 / sz,(ON_3dVector *)&zaxis.z);
        ::operator*((ON_3dVector *)local_f8,2.0 / X.z,(ON_3dVector *)&sx);
        (this->m_Pxyz).m_xform[0][0] = Y.z;
        (this->m_Pxyz).m_xform[0][1] = X.x;
        (this->m_Pxyz).m_xform[0][2] = X.y;
        (this->m_Pxyz).m_xform[0][3] = X.y * local_178 + Y.z * xaxis.z + X.x * local_170;
        (this->m_Pxyz).m_xform[1][0] = Z.z;
        (this->m_Pxyz).m_xform[1][1] = Y.x;
        (this->m_Pxyz).m_xform[1][2] = Y.y;
        (this->m_Pxyz).m_xform[1][3] = Y.y * local_178 + Z.z * xaxis.z + Y.x * local_170;
        (this->m_Pxyz).m_xform[2][0] = (double)local_f8;
        (this->m_Pxyz).m_xform[2][1] = Z.x;
        (this->m_Pxyz).m_xform[2][2] = Z.y;
        (this->m_Pxyz).m_xform[2][3] =
             Z.y * local_178 + (double)local_f8 * xaxis.z + Z.x * local_170;
        (this->m_Pxyz).m_xform[3][0] = 0.0;
        (this->m_Pxyz).m_xform[3][1] = 0.0;
        (this->m_Pxyz).m_xform[3][2] = 0.0;
        (this->m_Pxyz).m_xform[3][3] = 1.0;
        ::operator*(&local_110,sy * 0.5,(ON_3dVector *)&yaxis.z);
        Y.z = local_110.x;
        ::operator*(&local_128,sz * 0.5,(ON_3dVector *)&zaxis.z);
        Z.z = local_128.x;
        Y.x = local_128.y;
        Y.y = local_128.z;
        ::operator*(&local_140,X.z * 0.5,(ON_3dVector *)&sx);
        local_f8 = (undefined1  [8])local_140.x;
        Z.x = local_140.y;
        Z.y = local_140.z;
        (this->m_Nxyz).m_xform[0][0] = Y.z;
        (this->m_Nxyz).m_xform[0][1] = local_110.y;
        (this->m_Nxyz).m_xform[0][2] = local_110.z;
        (this->m_Nxyz).m_xform[0][3] = 0.0;
        (this->m_Nxyz).m_xform[1][0] = Z.z;
        (this->m_Nxyz).m_xform[1][1] = Y.x;
        (this->m_Nxyz).m_xform[1][2] = Y.y;
        (this->m_Nxyz).m_xform[1][3] = 0.0;
        (this->m_Nxyz).m_xform[2][0] = local_140.x;
        (this->m_Nxyz).m_xform[2][1] = local_140.y;
        (this->m_Nxyz).m_xform[2][2] = local_140.z;
        (this->m_Nxyz).m_xform[2][3] = 0.0;
        (this->m_Nxyz).m_xform[3][0] = 0.0;
        (this->m_Nxyz).m_xform[3][1] = 0.0;
        (this->m_Nxyz).m_xform[3][2] = 0.0;
        (this->m_Nxyz).m_xform[3][3] = 1.0;
        this->m_type = plane_mapping;
        ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_TextureMapping::SetPlaneMapping(
          const ON_Plane& plane,
          const ON_Interval& dx,
          const ON_Interval& dy,
          const ON_Interval& dz
          )
{
  *this = ON_TextureMapping::Unset;

  // Don't call plane.IsValid(), because the plane
  // equation does not matter and many developers
  // forget to set it correctly.
  if ( !plane.origin.IsValid() )
    return false;
  if ( !ON_IsRightHandFrame( plane.xaxis, plane.yaxis, plane.zaxis ) )
    return false;
  if ( !dx.IsValid() || !dy.IsValid() || !dz.IsValid() )
    return false;

  ON_3dPoint C = plane.PointAt(dx.Mid(),dy.Mid(),dz.Mid());
  C.x = (0.0 == C.x) ? 0.0 : -C.x;
  C.y = (0.0 == C.y) ? 0.0 : -C.y;
  C.z = (0.0 == C.z) ? 0.0 : -C.z;
  ON_3dVector xaxis = plane.xaxis;
  ON_3dVector yaxis = plane.yaxis;
  ON_3dVector zaxis = plane.zaxis;

  // Any "cleanup" needs to be done here
  // to xaxis, yaxis, zaxis.

  double sx,sy,sz;
  if ( 0.0 == (sx = dx.Length())) sx = 2.0;
  if ( 0.0 == (sy = dy.Length())) sy = 2.0;
  if ( 0.0 == (sz = dz.Length())) sz = 2.0;

  // The plane mapping matrix m_Pxyz transforms the
  // world coordinate rectangle to a (-1<=r<=1,
  // on plane to a
  // 1 X 1 square in the xy plane centered at the
  // origin.

  // m_Pxyz = surface point transformation
  ON_3dVector X = (2.0/sx)*xaxis;
  ON_3dVector Y = (2.0/sy)*yaxis;
  ON_3dVector Z = (2.0/sz)*zaxis;

  m_Pxyz.m_xform[0][0] = X.x;
  m_Pxyz.m_xform[0][1] = X.y;
  m_Pxyz.m_xform[0][2] = X.z;
  m_Pxyz.m_xform[0][3] = (X.x*C.x + X.y*C.y + X.z*C.z);

  m_Pxyz.m_xform[1][0] = Y.x;
  m_Pxyz.m_xform[1][1] = Y.y;
  m_Pxyz.m_xform[1][2] = Y.z;
  m_Pxyz.m_xform[1][3] = (Y.x*C.x + Y.y*C.y + Y.z*C.z);

  m_Pxyz.m_xform[2][0] = Z.x;
  m_Pxyz.m_xform[2][1] = Z.y;
  m_Pxyz.m_xform[2][2] = Z.z;
  m_Pxyz.m_xform[2][3] = (Z.x*C.x + Z.y*C.y + Z.z*C.z);

  m_Pxyz.m_xform[3][0] = 0.0;
  m_Pxyz.m_xform[3][1] = 0.0;
  m_Pxyz.m_xform[3][2] = 0.0;
  m_Pxyz.m_xform[3][3] = 1.0;

  // m_Nxyz = surface normal transformation
  //        = inverse transpose of upper 3x3 of m_Pxyz
  X = (0.5*sx)*xaxis;
  Y = (0.5*sy)*yaxis;
  Z = (0.5*sz)*zaxis;
  m_Nxyz.m_xform[0][0] = X.x;
  m_Nxyz.m_xform[0][1] = X.y;
  m_Nxyz.m_xform[0][2] = X.z;
  m_Nxyz.m_xform[0][3] = 0.0;

  m_Nxyz.m_xform[1][0] = Y.x;
  m_Nxyz.m_xform[1][1] = Y.y;
  m_Nxyz.m_xform[1][2] = Y.z;
  m_Nxyz.m_xform[1][3] = 0.0;

  m_Nxyz.m_xform[2][0] = Z.x;
  m_Nxyz.m_xform[2][1] = Z.y;
  m_Nxyz.m_xform[2][2] = Z.z;
  m_Nxyz.m_xform[2][3] = 0.0;

  m_Nxyz.m_xform[3][0] = 0.0;
  m_Nxyz.m_xform[3][1] = 0.0;
  m_Nxyz.m_xform[3][2] = 0.0;
  m_Nxyz.m_xform[3][3] = 1.0;

  m_type = ON_TextureMapping::TYPE::plane_mapping;
  SetId();

#if defined(ON_DEBUG)
  {
    ON_Plane p;
    p.xaxis = (2.0/sx)*plane.xaxis;
    p.yaxis = (2.0/sy)*plane.yaxis;
    p.zaxis = (2.0/sz)*plane.zaxis;
    p.origin.Set(-C.x,-C.y,-C.z);
    p.UpdateEquation();
    ON_Xform P_dbg, N_dbg;
    P_dbg.Rotation(p,ON_xy_plane);
    P_dbg.GetSurfaceNormalXform(N_dbg);

    for ( int i = 0; i < 4; i++ )
    {
      for ( int j = 0; j < 4; j++ )
      {
        if ( fabs(m_Pxyz[i][j] - P_dbg[i][j]) >= ON_SQRT_EPSILON*(fabs(m_Pxyz[i][j])+128.0) )
        {
          ON_ERROR("m_Pxyz is nor right\n");
          break;
        }
        if ( fabs(m_Nxyz[i][j] - N_dbg[i][j]) >= ON_SQRT_EPSILON*(fabs(m_Nxyz[i][j])+128.0) )
        {
          ON_ERROR("m_Nxyz is nor right\n");
          break;
        }
      }
    }
  }
#endif
	return true;
}